

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_duplex.cpp
# Opt level: O2

void state_cb_duplex(cubeb_stream *stream,void *param_2,cubeb_state state)

{
  char *__ptr;
  
  if (stream == (cubeb_stream *)0x0) {
    return;
  }
  if (state == CUBEB_STATE_DRAINED) {
    __ptr = "stream drained\n";
  }
  else if (state == CUBEB_STATE_STOPPED) {
    __ptr = "stream stopped\n";
  }
  else {
    if (state != CUBEB_STATE_STARTED) {
      fprintf(_stderr,"unknown stream state %d\n");
      return;
    }
    __ptr = "stream started\n";
  }
  fwrite(__ptr,0xf,1,_stderr);
  return;
}

Assistant:

void state_cb_duplex(cubeb_stream * stream, void * /*user*/, cubeb_state state)
{
  if (stream == NULL)
    return;

  switch (state) {
  case CUBEB_STATE_STARTED:
    fprintf(stderr, "stream started\n"); break;
  case CUBEB_STATE_STOPPED:
    fprintf(stderr, "stream stopped\n"); break;
  case CUBEB_STATE_DRAINED:
    fprintf(stderr, "stream drained\n"); break;
  default:
    fprintf(stderr, "unknown stream state %d\n", state);
  }

  return;
}